

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<Qt::Key>>
          (QtPrivate *this,QDebug debug,char *which,QList<Qt::Key> *c)

{
  char *pcVar1;
  QTextStream *pQVar2;
  long lVar3;
  undefined8 uVar4;
  storage_type *psVar5;
  Key *pKVar6;
  Key *pKVar7;
  storage_type *psVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QDebugStateSaver saver;
  QDebug local_78;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  undefined1 *local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar2 = *(QTextStream **)debug.stream;
  pQVar2[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar8 = (storage_type *)0x0;
  }
  else {
    psVar5 = (storage_type *)0xffffffffffffffff;
    do {
      psVar8 = psVar5 + 1;
      pcVar1 = which + 1 + (long)psVar5;
      psVar5 = psVar8;
    } while (*pcVar1 != '\0');
  }
  QVar9.m_data = psVar8;
  QVar9.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar2,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pKVar7 = (c->d).ptr;
  lVar3 = (c->d).size;
  pKVar6 = pKVar7 + lVar3;
  if (lVar3 != 0) {
    local_68.stream = *debug.stream;
    (local_68.stream)->ref = (local_68.stream)->ref + 1;
    qt_QMetaEnum_debugOperator
              ((QDebug *)&local_60,(longlong)&local_68,(QMetaObject *)(ulong)*pKVar7,
               (char *)&Qt::staticMetaObject);
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug(&local_68);
    pKVar7 = pKVar7 + 1;
  }
  if (pKVar7 != pKVar6) {
    do {
      pQVar2 = *(QTextStream **)debug.stream;
      QVar10.m_data = (storage_type *)0x2;
      QVar10.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<(pQVar2,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      local_78.stream = *debug.stream;
      (local_78.stream)->ref = (local_78.stream)->ref + 1;
      qt_QMetaEnum_debugOperator
                ((QDebug *)&local_70,(longlong)&local_78,(QMetaObject *)(ulong)*pKVar7,
                 (char *)&Qt::staticMetaObject);
      QDebug::~QDebug(&local_70);
      QDebug::~QDebug(&local_78);
      pKVar7 = pKVar7 + 1;
    } while (pKVar7 != pKVar6);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  uVar4 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar4;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}